

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineeFrameInfo.cpp
# Opt level: O0

bool __thiscall
BailoutConstantValue::IsEqual(BailoutConstantValue *this,BailoutConstantValue *bailoutConstValue)

{
  BailoutConstantValue *bailoutConstValue_local;
  BailoutConstantValue *this_local;
  
  if (this->type == bailoutConstValue->type) {
    if (this->type == TyInt32) {
      this_local._7_1_ = this->u == bailoutConstValue->u;
    }
    else if (this->type == TyVar) {
      this_local._7_1_ = this->u == bailoutConstValue->u;
    }
    else {
      this_local._7_1_ = (double)this->u == (double)bailoutConstValue->u;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool BailoutConstantValue::IsEqual(const BailoutConstantValue & bailoutConstValue)
{
    if (this->type == bailoutConstValue.type)
    {
        if (this->type == TyInt32)
        {
            return this->u.intConst.value == bailoutConstValue.u.intConst.value;
        }
        else if (this->type == TyVar)
        {
            return this->u.varConst.value == bailoutConstValue.u.varConst.value;
        }
        else
        {
            return this->u.floatConst.value == bailoutConstValue.u.floatConst.value;
        }
    }
    return false;
}